

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection
          (ReflectionTester *this,Message *message)

{
  FieldDescriptor *pFVar1;
  Message *pMVar2;
  Reflection *this_00;
  Metadata MVar3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  MVar3 = Message::GetMetadata(message);
  this_00 = MVar3.reflection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_int32",&local_c2)
  ;
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt32(this_00,message,pFVar1,1,0x1f5);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_int64",&local_c2)
  ;
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt64(this_00,message,pFVar1,1,0x1f6);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_uint32",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedUInt32(this_00,message,pFVar1,1,0x1f7);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_uint64",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedUInt64(this_00,message,pFVar1,1,0x1f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_sint32",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt32(this_00,message,pFVar1,1,0x1f9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_sint64",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt64(this_00,message,pFVar1,1,0x1fa);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_fixed32",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedUInt32(this_00,message,pFVar1,1,0x1fb);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_fixed64",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedUInt64(this_00,message,pFVar1,1,0x1fc);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_sfixed32",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt32(this_00,message,pFVar1,1,0x1fd);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_sfixed64",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedInt64(this_00,message,pFVar1,1,0x1fe);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_float",&local_c2)
  ;
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedFloat(this_00,message,pFVar1,1,511.0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_double",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedDouble(this_00,message,pFVar1,1,512.0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_bool",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedBool(this_00,message,pFVar1,1,true);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_string",&local_c2);
  pFVar1 = F(this,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"515",&local_c1);
  Reflection::SetRepeatedString(this_00,message,pFVar1,1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_bytes",&local_c2)
  ;
  pFVar1 = F(this,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"516",&local_c1);
  Reflection::SetRepeatedString(this_00,message,pFVar1,1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeatedgroup",&local_c2);
  pFVar1 = F(this,&local_c0);
  pMVar2 = Reflection::MutableRepeatedMessage(this_00,message,pFVar1,1);
  std::__cxx11::string::~string((string *)&local_c0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->repeated_group_a_,0x205);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_nested_message",&local_c2);
  pFVar1 = F(this,&local_c0);
  pMVar2 = Reflection::MutableRepeatedMessage(this_00,message,pFVar1,1);
  std::__cxx11::string::~string((string *)&local_c0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x206);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_foreign_message",&local_c2);
  pFVar1 = F(this,&local_c0);
  pMVar2 = Reflection::MutableRepeatedMessage(this_00,message,pFVar1,1);
  std::__cxx11::string::~string((string *)&local_c0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->foreign_c_,0x207);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_import_message",&local_c2);
  pFVar1 = F(this,&local_c0);
  pMVar2 = Reflection::MutableRepeatedMessage(this_00,message,pFVar1,1);
  std::__cxx11::string::~string((string *)&local_c0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->import_d_,0x208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_lazy_message",&local_c2);
  pFVar1 = F(this,&local_c0);
  pMVar2 = Reflection::MutableRepeatedMessage(this_00,message,pFVar1,1);
  std::__cxx11::string::~string((string *)&local_c0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x20f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_nested_enum",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedEnum(this_00,message,pFVar1,1,this->nested_foo_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_foreign_enum",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedEnum(this_00,message,pFVar1,1,this->foreign_foo_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_import_enum",&local_c2);
  pFVar1 = F(this,&local_c0);
  Reflection::SetRepeatedEnum(this_00,message,pFVar1,1,this->import_foo_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"repeated_string_piece",&local_c2);
  pFVar1 = F(this,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"524",&local_c1);
  Reflection::SetRepeatedString(this_00,message,pFVar1,1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"repeated_cord",&local_c2);
  pFVar1 = F(this,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"525",&local_c1);
  Reflection::SetRepeatedString(this_00,message,pFVar1,1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection(
    Message* message) {
  const Reflection* reflection = message->GetReflection();
  Message* sub_message;

  reflection->SetRepeatedInt32(message, F("repeated_int32"), 1, 501);
  reflection->SetRepeatedInt64(message, F("repeated_int64"), 1, 502);
  reflection->SetRepeatedUInt32(message, F("repeated_uint32"), 1, 503);
  reflection->SetRepeatedUInt64(message, F("repeated_uint64"), 1, 504);
  reflection->SetRepeatedInt32(message, F("repeated_sint32"), 1, 505);
  reflection->SetRepeatedInt64(message, F("repeated_sint64"), 1, 506);
  reflection->SetRepeatedUInt32(message, F("repeated_fixed32"), 1, 507);
  reflection->SetRepeatedUInt64(message, F("repeated_fixed64"), 1, 508);
  reflection->SetRepeatedInt32(message, F("repeated_sfixed32"), 1, 509);
  reflection->SetRepeatedInt64(message, F("repeated_sfixed64"), 1, 510);
  reflection->SetRepeatedFloat(message, F("repeated_float"), 1, 511);
  reflection->SetRepeatedDouble(message, F("repeated_double"), 1, 512);
  reflection->SetRepeatedBool(message, F("repeated_bool"), 1, true);
  reflection->SetRepeatedString(message, F("repeated_string"), 1, "515");
  reflection->SetRepeatedString(message, F("repeated_bytes"), 1, "516");

  sub_message =
      reflection->MutableRepeatedMessage(message, F("repeatedgroup"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 517);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_nested_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 518);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_foreign_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 519);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_import_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 520);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_lazy_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 527);

  reflection->SetRepeatedEnum(message, F("repeated_nested_enum"), 1,
                              nested_foo_);
  reflection->SetRepeatedEnum(message, F("repeated_foreign_enum"), 1,
                              foreign_foo_);
  reflection->SetRepeatedEnum(message, F("repeated_import_enum"), 1,
                              import_foo_);

  reflection->SetRepeatedString(message, F("repeated_string_piece"), 1, "524");
  reflection->SetRepeatedString(message, F("repeated_cord"), 1, "525");
}